

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O2

void rsg::interpolateFragmentInput<64>
               (StridedValueAccess<64> dst,int dstComp,ConstValueAccess vtx0,ConstValueAccess vtx1,
               ConstValueAccess vtx2,ConstValueAccess vtx3,float x,float y)

{
  Scalar SVar1;
  Scalar SVar2;
  Scalar SVar3;
  TestError *this;
  int compNdx;
  int iVar4;
  float fVar5;
  ConstStridedValueAccess<1> CVar6;
  StridedValueAccess<64> SVar7;
  Scalar local_60;
  Scalar local_5c;
  Scalar local_58;
  Scalar local_54;
  ConstValueAccess vtx0_local;
  StridedValueAccess<64> dst_local;
  
  vtx0_local.m_value = vtx0.m_value;
  vtx0_local.m_type = vtx0.m_type;
  dst_local.super_ConstStridedValueAccess<64>.m_value =
       dst.super_ConstStridedValueAccess<64>.m_value;
  dst_local.super_ConstStridedValueAccess<64>.m_type = dst.super_ConstStridedValueAccess<64>.m_type;
  if ((dst_local.super_ConstStridedValueAccess<64>.m_type)->m_baseType == TYPE_FLOAT) {
    iVar4 = (dst_local.super_ConstStridedValueAccess<64>.m_type)->m_numElements;
    compNdx = 0;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    for (; iVar4 != compNdx; compNdx = compNdx + 1) {
      CVar6 = ConstStridedValueAccess<1>::component(&vtx0_local,compNdx);
      SVar1 = *CVar6.m_value;
      CVar6 = ConstStridedValueAccess<1>::component(&vtx1,compNdx);
      SVar2 = *CVar6.m_value;
      CVar6 = ConstStridedValueAccess<1>::component(&vtx2,compNdx);
      SVar3 = *CVar6.m_value;
      CVar6 = ConstStridedValueAccess<1>::component(&vtx3,compNdx);
      local_54 = *CVar6.m_value;
      local_60 = SVar1;
      local_5c = SVar2;
      local_58 = SVar3;
      fVar5 = interpolateFragment((Vec4 *)&local_60,x,y);
      SVar7 = StridedValueAccess<64>::component(&dst_local,compNdx);
      SVar7.super_ConstStridedValueAccess<64>.m_value[dstComp].floatVal = fVar5;
    }
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"dst.getType().getBaseType() == VariableType::TYPE_FLOAT",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgProgramExecutor.cpp"
             ,0x99);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void interpolateFragmentInput (StridedValueAccess<Stride> dst, int dstComp, ConstValueAccess vtx0, ConstValueAccess vtx1, ConstValueAccess vtx2, ConstValueAccess vtx3, float x, float y)
{
	TCU_CHECK(dst.getType().getBaseType() == VariableType::TYPE_FLOAT);
	int numElements = dst.getType().getNumElements();
	for (int ndx = 0; ndx < numElements; ndx++)
		dst.component(ndx).asFloat(dstComp) = interpolateFragment(tcu::Vec4(vtx0.component(ndx).asFloat(), vtx1.component(ndx).asFloat(), vtx2.component(ndx).asFloat(), vtx3.component(ndx).asFloat()), x, y);
}